

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O3

_Bool cs_reg_write(csh ud,cs_insn *insn,uint reg_id)

{
  cs_detail *pcVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  _Bool _Var5;
  
  if (ud == 0) {
    return false;
  }
  if (*(int *)(ud + 0x68) != 0) {
    if (insn->id == 0) {
      *(undefined4 *)(ud + 0x58) = 0xb;
      return false;
    }
    pcVar1 = insn->detail;
    if (pcVar1 != (cs_detail *)0x0) {
      uVar3 = (ulong)pcVar1->regs_write_count;
      if (uVar3 == 0) {
        return false;
      }
      _Var5 = true;
      if (pcVar1->regs_write[0] != reg_id) {
        lVar2 = 0;
        do {
          lVar4 = lVar2;
          if (uVar3 - 1 == lVar4) break;
          lVar2 = lVar4 + 1;
        } while (pcVar1->regs_write[lVar4 + 1] != reg_id);
        _Var5 = lVar4 + 1U < uVar3;
      }
      return _Var5;
    }
  }
  *(undefined4 *)(ud + 0x58) = 7;
  return false;
}

Assistant:

CAPSTONE_API cs_reg_write(csh ud, const cs_insn *insn, unsigned int reg_id)
{
	struct cs_struct *handle;
	if (!ud)
		return false;

	handle = (struct cs_struct *)(uintptr_t)ud;

	if (!handle->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return false;
	}

	if(!insn->id) {
		handle->errnum = CS_ERR_SKIPDATA;
		return false;
	}

	if(!insn->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return false;
	}

	return arr_exist(insn->detail->regs_write, insn->detail->regs_write_count, reg_id);
}